

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_AddNodesResult *
addNodeInternalWithType
          (UA_AddNodesResult *__return_storage_ptr__,UA_Server *server,UA_Node *node,
          UA_NodeId parentNodeId,UA_NodeId referenceTypeId,UA_NodeId typeIdentifier)

{
  UA_StatusCode UVar1;
  UA_AddNodesResult *res;
  UA_Node *node_local;
  UA_Server *server_local;
  
  UA_AddNodesResult_init(__return_storage_ptr__);
  UVar1 = Service_AddNodes_existing
                    (server,&adminSession,node,&parentNodeId,&referenceTypeId,&typeIdentifier,
                     (UA_InstantiationCallback *)0x0,&__return_storage_ptr__->addedNodeId);
  __return_storage_ptr__->statusCode = UVar1;
  return __return_storage_ptr__;
}

Assistant:

static UA_AddNodesResult
addNodeInternalWithType(UA_Server *server, UA_Node *node, const UA_NodeId parentNodeId,
                        const UA_NodeId referenceTypeId, const UA_NodeId typeIdentifier) {
    UA_AddNodesResult res;
    UA_AddNodesResult_init(&res);
    UA_RCU_LOCK();
    res.statusCode = Service_AddNodes_existing(server, &adminSession, node, &parentNodeId,
                                               &referenceTypeId, &typeIdentifier,
                                               NULL, &res.addedNodeId);
    UA_RCU_UNLOCK();
    return res;
}